

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

void __thiscall
TPZCompElH1<pzshape::TPZShapePoint>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapePoint> *this,TPZCompMesh *mesh,
          TPZCompElH1<pzshape::TPZShapePoint> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  bool bVar3;
  mapped_type_conflict *pmVar4;
  ostream *poVar5;
  size_t sVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  int64_t glIdx;
  stringstream sout;
  long local_1e8;
  TPZManVector<long,_1> *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePoint>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0197bea0;
  TPZIntelGen<pzshape::TPZShapePoint>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePoint>,&PTR_PTR_019784b8,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapePoint>,gl2lcConMap,gl2lcElMap);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePoint>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_019780e8;
  local_1e0 = &this->fConnectIndexes;
  TPZVec<long>::TPZVec(&local_1e0->super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018b4e60;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 1;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  (this->fConnectIndexes).fExtAlloc[0] = -1;
  this->fh1fam = copy->fh1fam;
  p_Var1 = &(gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header;
  bVar3 = true;
  lVar9 = 0;
  do {
    if (!bVar3) {
      return;
    }
    local_1e8 = (copy->fConnectIndexes).super_TPZVec<long>.fStore[lVar9];
    p_Var8 = (gl2lcConMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
        p_Var8 = (&p_Var8->_M_left)[(long)*(size_t *)(p_Var8 + 1) < local_1e8]) {
      if (local_1e8 <= (long)*(size_t *)(p_Var8 + 1)) {
        p_Var7 = p_Var8;
      }
    }
    p_Var8 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (p_Var8 = p_Var7, local_1e8 < (long)*(size_t *)(p_Var7 + 1))) {
      p_Var8 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 == p_Var1) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"ERROR in : ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,
                 "TPZCompElH1<pzshape::TPZShapePoint>::TPZCompElH1(TPZCompMesh &, const TPZCompElH1<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapePoint]"
                 ,0xba);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8," trying to clone the connect index: ",0x24);
      poVar5 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," wich is not in mapped connect indexes!",0x27);
      std::__cxx11::stringbuf::str();
      plVar2 = local_1d8;
      if (local_1d8 == (long *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a5d2a8);
      }
      else {
        sVar6 = strlen((char *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)plVar2,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar9] = -1;
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      pmVar4 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](gl2lcConMap,&local_1e8);
      (this->fConnectIndexes).super_TPZVec<long>.fStore[lVar9] = *pmVar4;
    }
    bVar3 = false;
    lVar9 = 1;
  } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh,
								 const TPZCompElH1<TSHAPE> &copy,
								 std::map<int64_t,int64_t> & gl2lcConMap,
								 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElH1::ClassId), 
TPZIntelGen<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap), fh1fam(copy.fh1fam)
{
	int i;
	for(i=0;i<TSHAPE::NSides;i++)
	{
		int64_t lcIdx = -1;
		int64_t glIdx = copy.fConnectIndexes[i];
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end()) lcIdx = gl2lcConMap[glIdx];
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			fConnectIndexes[i] = -1;
			return;
		}
		fConnectIndexes[i] = lcIdx;
	}
  //TODO:NATHANFRAN
}